

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

shared_ptr<kratos::Var> __thiscall kratos::Var::cast(Var *this,VarCastType cast_type)

{
  _Base_ptr *pp_Var1;
  pointer ppVar2;
  _Rb_tree_node_base *p_Var3;
  VarCastType VVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
  *this_00;
  undefined1 auVar5 [16];
  pair<std::_Rb_tree_iterator<std::shared_ptr<kratos::VarCasted>_>,_bool> pVar6;
  shared_ptr<kratos::Var> sVar7;
  Var *local_48;
  _func_int **local_40;
  pointer local_38;
  VarCastType local_30;
  undefined1 local_29;
  VarCastType cast_type_local;
  
  local_48 = (Var *)CONCAT44(in_register_00000034,cast_type);
  VVar4 = (VarCastType)in_RDX._M_pi;
  local_30 = VVar4;
  if ((VVar4 == Signed) && (local_48->is_signed_ == true)) {
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &local_48->super_enable_shared_from_this<kratos::Var>);
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    p_Var3 = (local_48->casted_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var3 != &(local_48->casted_)._M_t._M_impl.super__Rb_tree_header) {
      if ((VVar4 != Resize) && (*(VarCastType *)(*(_func_int ***)(p_Var3 + 1) + 0x50) == VVar4)) {
        (this->super_IRNode)._vptr_IRNode = *(_func_int ***)(p_Var3 + 1);
        ppVar2 = (pointer)p_Var3[1]._M_parent;
        (this->super_IRNode).fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = ppVar2;
        if (ppVar2 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pp_Var1 = (_Base_ptr *)&(ppVar2->first)._M_string_length;
            *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
            UNLOCK();
          }
          else {
            pp_Var1 = (_Base_ptr *)&(ppVar2->first)._M_string_length;
            *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
          }
        }
        goto LAB_00185a5e;
      }
      auVar5 = std::_Rb_tree_increment(p_Var3);
      in_RDX._M_pi = auVar5._8_8_;
      p_Var3 = auVar5._0_8_;
    }
    this_00 = &local_48->casted_;
    std::__shared_ptr<kratos::VarCasted,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<kratos::VarCasted>,kratos::Var*,kratos::VarCastType&>
              ((__shared_ptr<kratos::VarCasted,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (allocator<kratos::VarCasted> *)&local_29,&local_48,&local_30);
    pVar6 = std::
            _Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
            ::_M_emplace_unique<std::shared_ptr<kratos::VarCasted>&>
                      ((_Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
                        *)this_00,(shared_ptr<kratos::VarCasted> *)&local_40);
    in_RDX._M_pi = pVar6._8_8_;
    (this->super_IRNode)._vptr_IRNode = local_40;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_38;
  }
LAB_00185a5e:
  sVar7.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi
  ;
  sVar7.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::Var>)sVar7.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Var> Var::cast(VarCastType cast_type) {
    if (cast_type == VarCastType::Signed && is_signed_) {
        return shared_from_this();
    } else {
        // optimize memory for speed
        for (auto const &casted : casted_) {
            if (casted->cast_type() == cast_type && cast_type != VarCastType::Resize) {
                return casted;
            }
        }
        auto v = std::make_shared<VarCasted>(this, cast_type);
        casted_.emplace(v);
        return v;
    }
}